

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

Session * FIX::Session::lookupSession(string *string,bool reverse)

{
  Header *this;
  pointer pcVar1;
  bool bVar2;
  FieldBase *pFVar3;
  FieldBase *pFVar4;
  FieldBase *pFVar5;
  Session *pSVar6;
  Message message;
  string local_3a8;
  undefined1 local_388 [16];
  string local_378;
  _Alloc_hider local_358;
  size_type local_350;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  field_metrics local_338;
  SessionID local_330;
  FieldBase local_1e0;
  Message local_188;
  
  Message::Message(&local_188);
  bVar2 = Message::setStringHeader(&local_188,string);
  if (bVar2) {
    this = &local_188.m_header;
    pFVar3 = FieldMap::getFieldRef(&this->super_FieldMap,8);
    pFVar4 = FieldMap::getFieldRef(&this->super_FieldMap,0x31);
    pFVar5 = FieldMap::getFieldRef(&this->super_FieldMap,0x38);
    if (reverse) {
      local_388._0_8_ = &PTR__FieldBase_001f55c8;
      local_388._8_4_ = 0x31;
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      pcVar1 = (pFVar5->m_string)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_378,pcVar1,pcVar1 + (pFVar5->m_string)._M_string_length);
      local_358._M_p = (pointer)&local_348;
      local_350 = 0;
      local_348._M_local_buf[0] = '\0';
      local_338.m_length = 0;
      local_338.m_checksum = 0;
      local_388._0_8_ = &PTR__FieldBase_001f55e8;
      local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f55c8;
      local_1e0.m_tag = 0x38;
      local_1e0.m_string._M_dataplus._M_p = (pointer)&local_1e0.m_string.field_2;
      pcVar1 = (pFVar4->m_string)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1e0.m_string,pcVar1,pcVar1 + (pFVar4->m_string)._M_string_length);
      local_1e0.m_data._M_dataplus._M_p = (pointer)&local_1e0.m_data.field_2;
      local_1e0.m_data._M_string_length = 0;
      local_1e0.m_data.field_2._M_local_buf[0] = '\0';
      local_1e0.m_metrics.m_length = 0;
      local_1e0.m_metrics.m_checksum = 0;
      local_1e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f5620;
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3a8,"");
      SessionID::SessionID(&local_330,&pFVar3->m_string,&local_378,&local_1e0.m_string,&local_3a8);
      pSVar6 = lookupSession(&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.m_frozenString._M_dataplus._M_p != &local_330.m_frozenString.field_2) {
        operator_delete(local_330.m_frozenString._M_dataplus._M_p,
                        local_330.m_frozenString.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.m_sessionQualifier._M_dataplus._M_p != &local_330.m_sessionQualifier.field_2)
      {
        operator_delete(local_330.m_sessionQualifier._M_dataplus._M_p,
                        local_330.m_sessionQualifier.field_2._M_allocated_capacity + 1);
      }
      FieldBase::~FieldBase((FieldBase *)&local_330.m_targetCompID);
      FieldBase::~FieldBase((FieldBase *)&local_330.m_senderCompID);
      FieldBase::~FieldBase((FieldBase *)&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
        operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
      }
      FieldBase::~FieldBase(&local_1e0);
      FieldBase::~FieldBase((FieldBase *)local_388);
    }
    else {
      local_388._0_8_ = &local_378;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"");
      SessionID::SessionID
                (&local_330,&pFVar3->m_string,&pFVar4->m_string,&pFVar5->m_string,
                 (string *)local_388);
      pSVar6 = lookupSession(&local_330);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.m_frozenString._M_dataplus._M_p != &local_330.m_frozenString.field_2) {
        operator_delete(local_330.m_frozenString._M_dataplus._M_p,
                        local_330.m_frozenString.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_330.m_sessionQualifier._M_dataplus._M_p != &local_330.m_sessionQualifier.field_2)
      {
        operator_delete(local_330.m_sessionQualifier._M_dataplus._M_p,
                        local_330.m_sessionQualifier.field_2._M_allocated_capacity + 1);
      }
      FieldBase::~FieldBase((FieldBase *)&local_330.m_targetCompID);
      FieldBase::~FieldBase((FieldBase *)&local_330.m_senderCompID);
      FieldBase::~FieldBase((FieldBase *)&local_330);
      if ((string *)local_388._0_8_ != &local_378) {
        operator_delete((void *)local_388._0_8_,(ulong)(local_378._M_dataplus._M_p + 1));
      }
    }
  }
  else {
    pSVar6 = (Session *)0x0;
  }
  Message::~Message(&local_188);
  return pSVar6;
}

Assistant:

Session *Session::lookupSession(const std::string &string, bool reverse) {
  Message message;
  if (!message.setStringHeader(string)) {
    return nullptr;
  }

  try {
    const Header &header = message.getHeader();
    const BeginString &beginString = FIELD_GET_REF(header, BeginString);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);

    if (reverse) {
      return lookupSession(SessionID(beginString, SenderCompID(targetCompID), TargetCompID(senderCompID)));
    }

    return lookupSession(SessionID(beginString, senderCompID, targetCompID));
  } catch (FieldNotFound &) {
    return nullptr;
  }
}